

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_close(CLOSE_HANDLE close)

{
  CLOSE_INSTANCE *close_instance;
  AMQP_VALUE result;
  CLOSE_HANDLE close_local;
  
  if (close == (CLOSE_HANDLE)0x0) {
    close_instance = (CLOSE_INSTANCE *)0x0;
  }
  else {
    close_instance = (CLOSE_INSTANCE *)amqpvalue_clone(close->composite_value);
  }
  return (AMQP_VALUE)close_instance;
}

Assistant:

AMQP_VALUE amqpvalue_create_close(CLOSE_HANDLE close)
{
    AMQP_VALUE result;

    if (close == NULL)
    {
        result = NULL;
    }
    else
    {
        CLOSE_INSTANCE* close_instance = (CLOSE_INSTANCE*)close;
        result = amqpvalue_clone(close_instance->composite_value);
    }

    return result;
}